

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O3

qpdf_offset_t __thiscall BufferInputSource::findAndSkipNextEOL(BufferInputSource *this)

{
  long lVar1;
  uchar *puVar2;
  logic_error *this_00;
  long lVar3;
  long lVar4;
  
  if (this->cur_offset < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"INTERNAL ERROR: BufferInputSource offset < 0");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  lVar1 = this->max_offset;
  if (this->cur_offset < lVar1) {
    puVar2 = Buffer::getBuffer(this->buf);
    lVar3 = this->cur_offset;
    if (lVar3 < lVar1) {
      do {
        lVar4 = lVar3;
        if ((puVar2[lVar3] == '\n') || (puVar2[lVar3] == '\r')) {
          do {
            lVar4 = lVar4 + 1;
            this->cur_offset = lVar4;
            if (lVar1 <= lVar4) {
              return lVar3;
            }
          } while ((puVar2[lVar4] == '\r') || (puVar2[lVar4] == '\n'));
          return lVar3;
        }
        lVar4 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (puVar2 + lVar4 < puVar2 + lVar1);
    }
  }
  else {
    (this->super_InputSource).last_offset = lVar1;
  }
  this->cur_offset = lVar1;
  return lVar1;
}

Assistant:

qpdf_offset_t
BufferInputSource::findAndSkipNextEOL()
{
    if (this->cur_offset < 0) {
        throw std::logic_error("INTERNAL ERROR: BufferInputSource offset < 0");
    }
    qpdf_offset_t end_pos = this->max_offset;
    if (this->cur_offset >= end_pos) {
        this->last_offset = end_pos;
        this->cur_offset = end_pos;
        return end_pos;
    }

    qpdf_offset_t result = 0;
    unsigned char const* buffer = this->buf->getBuffer();
    unsigned char const* end = buffer + end_pos;
    unsigned char const* p = buffer + this->cur_offset;

    while ((p < end) && !((*p == '\r') || (*p == '\n'))) {
        ++p;
    }
    if (p < end) {
        result = p - buffer;
        this->cur_offset = result + 1;
        ++p;
        while ((this->cur_offset < end_pos) && ((*p == '\r') || (*p == '\n'))) {
            ++p;
            ++this->cur_offset;
        }
    } else {
        this->cur_offset = end_pos;
        result = end_pos;
    }
    return result;
}